

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Curve.h
# Opt level: O0

vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
* __thiscall
anurbs::Curve<2L,_anurbs::Ref<anurbs::NurbsCurveGeometry<2L>_>_>::derivatives_at
          (vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
           *__return_storage_ptr__,Curve<2L,_anurbs::Ref<anurbs::NurbsCurveGeometry<2L>_>_> *this,
          double t,Index order)

{
  element_type *peVar1;
  shared_ptr<anurbs::NurbsCurveGeometry<2L>_> local_38;
  Index local_28;
  Index order_local;
  double t_local;
  Curve<2L,_anurbs::Ref<anurbs::NurbsCurveGeometry<2L>_>_> *this_local;
  
  local_28 = order;
  order_local = (Index)t;
  t_local = (double)this;
  this_local = (Curve<2L,_anurbs::Ref<anurbs::NurbsCurveGeometry<2L>_>_> *)__return_storage_ptr__;
  Ref<anurbs::NurbsCurveGeometry<2L>_>::operator->
            ((Ref<anurbs::NurbsCurveGeometry<2L>_> *)&local_38);
  peVar1 = std::
           __shared_ptr_access<anurbs::NurbsCurveGeometry<2L>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<anurbs::NurbsCurveGeometry<2L>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&local_38);
  (*(peVar1->super_CurveBase<2L>)._vptr_CurveBase[6])
            (order_local,__return_storage_ptr__,peVar1,local_28);
  std::shared_ptr<anurbs::NurbsCurveGeometry<2L>_>::~shared_ptr(&local_38);
  return __return_storage_ptr__;
}

Assistant:

std::vector<Vector> derivatives_at(const double t, const Index order)
        const override
    {
        return m_curve_geometry->derivatives_at(t, order);
    }